

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::copy_to_buf(CTcDataStream *this,char *buf,ulong start_ofs,ulong len)

{
  char *__src;
  ulong in_RCX;
  ulong in_RDX;
  void *in_RSI;
  CTcDataStream *in_RDI;
  size_t cur;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_20 = in_RCX; local_20 != 0; local_20 = local_20 - local_28) {
    local_28 = 65000 - local_18 % 65000;
    if (local_20 < local_28) {
      local_28 = local_20;
    }
    __src = calc_addr(in_RDI,local_18);
    memcpy(local_10,__src,local_28);
    local_18 = local_28 + local_18;
    local_10 = (void *)(local_28 + (long)local_10);
  }
  return;
}

Assistant:

void CTcDataStream::copy_to_buf(char *buf, ulong start_ofs, ulong len)
{
    /* read the data from each page that the block spans */
    while (len != 0)
    {
        size_t cur;
        
        /* 
         *   determine how much is left on the page containing the current
         *   starting offset 
         */
        cur = TCCS_PAGE_SIZE - (start_ofs % TCCS_PAGE_SIZE);
        
        /* 
         *   figure out how much we can copy - copy the whole remaining
         *   size, but no more than the amount remaining on this page 
         */
        if (cur > len)
            cur = (size_t)len;

        /* copy the data */
        memcpy(buf, calc_addr(start_ofs), cur);

        /* advance past this chunk */
        len -= cur;
        start_ofs += cur;
        buf += cur;
    }
}